

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DynamicTypeHandler::VerifyObjectHeaderInlinedTypeHandler(DynamicTypeHandler *this)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  PropertyIndex PVar4;
  uint uVar5;
  undefined4 *puVar6;
  DynamicTypeHandler *this_local;
  
  uVar3 = GetOffsetOfInlineSlots(this);
  bVar2 = IsObjectHeaderInlined(uVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xd1,"(IsObjectHeaderInlined(GetOffsetOfInlineSlots()))",
                                "IsObjectHeaderInlined(GetOffsetOfInlineSlots())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar3 = GetInlineSlotCapacity(this);
  PVar4 = GetObjectHeaderInlinableSlotCapacity();
  if (uVar3 < PVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xd2,
                                "(GetInlineSlotCapacity() >= GetObjectHeaderInlinableSlotCapacity())"
                                ,"GetInlineSlotCapacity() >= GetObjectHeaderInlinableSlotCapacity()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar3 = GetInlineSlotCapacity(this);
  uVar5 = GetSlotCapacity(this);
  if (uVar3 != uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xd3,"(GetInlineSlotCapacity() == GetSlotCapacity())",
                                "GetInlineSlotCapacity() == GetSlotCapacity()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return;
}

Assistant:

void DynamicTypeHandler::VerifyObjectHeaderInlinedTypeHandler() const
    {
        Assert(IsObjectHeaderInlined(GetOffsetOfInlineSlots()));
        Assert(GetInlineSlotCapacity() >= GetObjectHeaderInlinableSlotCapacity());
        Assert(GetInlineSlotCapacity() == GetSlotCapacity());
    }